

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O0

void btSwapScalarEndian(btScalar *sourceVal,btScalar *destVal)

{
  uchar *src;
  uchar *dest;
  btScalar *destVal_local;
  btScalar *sourceVal_local;
  
  *(undefined1 *)destVal = *(undefined1 *)((long)sourceVal + 3);
  *(undefined1 *)((long)destVal + 1) = *(undefined1 *)((long)sourceVal + 2);
  *(undefined1 *)((long)destVal + 2) = *(undefined1 *)((long)sourceVal + 1);
  *(undefined1 *)((long)destVal + 3) = *(undefined1 *)sourceVal;
  return;
}

Assistant:

SIMD_FORCE_INLINE void	btSwapScalarEndian(const btScalar& sourceVal, btScalar& destVal)
{
	#ifdef BT_USE_DOUBLE_PRECISION
	unsigned char* dest = (unsigned char*) &destVal;
	unsigned char* src  = (unsigned char*) &sourceVal;
	dest[0] = src[7];
    dest[1] = src[6];
    dest[2] = src[5];
    dest[3] = src[4];
    dest[4] = src[3];
    dest[5] = src[2];
    dest[6] = src[1];
    dest[7] = src[0];
#else
	unsigned char* dest = (unsigned char*) &destVal;
	unsigned char* src  = (unsigned char*) &sourceVal;
	dest[0] = src[3];
    dest[1] = src[2];
    dest[2] = src[1];
    dest[3] = src[0];
#endif //BT_USE_DOUBLE_PRECISION
}